

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_lsd.cpp
# Opt level: O3

void msd_lsd<10u>(Cacheblock<10U> *cache,size_t N,size_t depth)

{
  undefined8 *puVar1;
  int iVar2;
  undefined8 uVar3;
  size_t i;
  uchar *puVar4;
  void *__src;
  long lVar5;
  Cacheblock<10U> *pCVar6;
  long lVar7;
  long lVar8;
  size_t sVar9;
  Cacheblock<10U> *pCVar10;
  byte bVar11;
  byte bVar12;
  size_t sVar13;
  ulong N_00;
  uchar *puVar14;
  bool bVar15;
  long local_1038 [256];
  long local_838 [257];
  
  N_00 = N;
  if (N < 0x20) {
    pCVar6 = cache;
    if (N < 2) {
      return;
    }
  }
  else {
    do {
      fill_cache<10u>(cache,N_00,depth);
      puVar14 = (cache->chars)._M_elems + 9;
      lVar8 = 9;
      do {
        memset(local_1038 + 0x100,0,0x800);
        puVar4 = puVar14;
        sVar13 = N_00;
        do {
          local_1038[(ulong)*puVar4 + 0x100] = local_1038[(ulong)*puVar4 + 0x100] + 1;
          puVar4 = puVar4 + 0x18;
          sVar13 = sVar13 - 1;
        } while (sVar13 != 0);
        __src = malloc(N_00 * 0x18);
        local_1038[0] = 0;
        lVar5 = 1;
        lVar7 = 0;
        do {
          lVar7 = lVar7 + local_1038[lVar5 + 0xff];
          local_1038[lVar5] = lVar7;
          lVar5 = lVar5 + 1;
          pCVar6 = cache;
          sVar13 = N_00;
        } while (lVar5 != 0x100);
        do {
          bVar11 = (pCVar6->chars)._M_elems[lVar8];
          lVar5 = local_1038[bVar11];
          local_1038[bVar11] = lVar5 + 1;
          *(uchar **)((long)__src + lVar5 * 0x18 + 0x10) = pCVar6->ptr;
          uVar3 = *(undefined8 *)((pCVar6->chars)._M_elems + 8);
          puVar1 = (undefined8 *)((long)__src + lVar5 * 0x18);
          *puVar1 = *(undefined8 *)(pCVar6->chars)._M_elems;
          puVar1[1] = uVar3;
          sVar13 = sVar13 - 1;
          pCVar6 = pCVar6 + 1;
        } while (sVar13 != 0);
        memcpy(cache,__src,N_00 * 0x18);
        free(__src);
        puVar14 = puVar14 + -1;
        bVar15 = lVar8 != 0;
        lVar8 = lVar8 + -1;
      } while (bVar15);
      if (N_00 == 1) {
        return;
      }
      depth = depth + 10;
      sVar9 = 1;
      N = 1;
      sVar13 = 0;
      pCVar6 = cache;
      do {
        if (*(short *)((pCVar6->chars)._M_elems + 8) == *(short *)(pCVar6[1].chars._M_elems + 8) &&
            *(long *)(pCVar6->chars)._M_elems == *(long *)pCVar6[1].chars._M_elems) {
          N = N + 1;
        }
        else {
          if ((1 < N) && (cache[sVar13].chars._M_elems[9] != '\0')) {
            msd_lsd<10u>(cache + sVar13,N,depth);
          }
          N = 1;
          sVar13 = sVar9;
        }
        sVar9 = sVar9 + 1;
        pCVar6 = pCVar6 + 1;
      } while (N_00 != sVar9);
      if (N < 2) {
        return;
      }
      if (cache[sVar13].chars._M_elems[9] == '\0') {
        return;
      }
      cache = cache + sVar13;
      N_00 = N;
      pCVar6 = cache;
    } while (0x1f < N);
  }
  do {
    puVar14 = cache[1].ptr;
    cache = cache + 1;
    for (pCVar10 = cache; pCVar6 < pCVar10; pCVar10 = pCVar10 + -1) {
      puVar4 = pCVar10[-1].ptr;
      bVar11 = puVar4[depth];
      bVar12 = puVar14[depth];
      if ((bVar11 != 0) && (sVar13 = depth, bVar11 == bVar12)) {
        do {
          sVar13 = sVar13 + 1;
          bVar11 = puVar4[sVar13];
          bVar12 = puVar14[sVar13];
          if (bVar11 == 0) break;
        } while (bVar11 == bVar12);
      }
      if (bVar11 <= bVar12) break;
      pCVar10->ptr = puVar4;
    }
    iVar2 = (int)N;
    pCVar10->ptr = puVar14;
    N = (size_t)(iVar2 - 1);
    if (iVar2 < 3) {
      return;
    }
  } while( true );
}

Assistant:

static void
msd_lsd(Cacheblock<CachedChars>* cache, size_t N, size_t depth)
{
	static_assert(CachedChars>=1, "CachedChars must be positive");
	if (N < 32) {
		insertion_sort(cache, N, depth);
		return;
	}
	fill_cache(cache, N, depth);
	for (int byte=CachedChars-1; byte >= 0; --byte) {
		size_t bucketsize[256] = {0};
		for (size_t i=0; i < N; ++i)
			++bucketsize[cache[i].chars[byte]];
		Cacheblock<CachedChars>* sorted = (Cacheblock<CachedChars>*)
			malloc(N*sizeof(Cacheblock<CachedChars>));
		size_t bucketindex[256];
		bucketindex[0] = 0;
		for (size_t i=1; i < 256; ++i)
			bucketindex[i] = bucketindex[i-1] + bucketsize[i-1];
		for (size_t i=0; i < N; ++i)
			memcpy(&sorted[bucketindex[cache[i].chars[byte]]++],
					cache+i,
					sizeof(Cacheblock<CachedChars>));
		memcpy(cache, sorted, N*sizeof(Cacheblock<CachedChars>));
		free(sorted);
	}
	size_t start=0, cnt=1;
	for (size_t i=0; i < N-1; ++i) {
		if (memcmp(cache[i].chars.data(), cache[i+1].chars.data(),
				CachedChars) == 0) {
			++cnt;
			continue;
		}
		if (cnt > 1 && cache[start].chars[CachedChars-1] != 0) {
			msd_lsd(cache+start, cnt, depth+CachedChars);
		}
		cnt = 1;
		start = i+1;
	}
	if (cnt > 1 && cache[start].chars[CachedChars-1] != 0) {
		msd_lsd(cache+start, cnt, depth+CachedChars);
	}
}